

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

PegoutKeyData *
cfd::core::ConfidentialTransaction::GetPegoutPubkeyData
          (PegoutKeyData *__return_storage_ptr__,Pubkey *online_pubkey,Privkey *master_online_key,
          string *bitcoin_descriptor,uint32_t bip32_counter,ByteData *whitelist,NetType net_type,
          ByteData *pubkey_prefix,NetType elements_net_type,Address *descriptor_derive_address)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  pointer *ppuVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  pointer puVar6;
  CfdException *pCVar7;
  ulong uVar8;
  ulong uVar9;
  size_t __n;
  uint uVar10;
  ByteData256 tweak_sum;
  ByteData prefix;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2c0;
  Pubkey local_2b8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> online_keys;
  ExtPubkey xpub;
  ByteData local_208;
  ByteData whitelist_proof;
  ByteData btcpubkeybytes;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> offline_keys;
  ExtPubkey child_xpub;
  ulong local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> whitelist_bytes;
  Pubkey offline_pubkey;
  ByteData local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  ByteData offline_pubkey_negate;
  ByteData local_90;
  Pubkey local_78;
  ByteData local_60;
  ByteData local_48;
  
  Pubkey::Pubkey(&__return_storage_ptr__->btc_pubkey_bytes);
  ByteData::ByteData(&__return_storage_ptr__->whitelist_proof);
  offline_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  offline_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  offline_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  online_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  online_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  online_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ByteData::GetBytes(&whitelist_bytes,whitelist);
  uVar10 = (int)whitelist_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
           (int)whitelist_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if ((uVar10 == 0) || (uVar10 != (uVar10 / 0x42) * 0x40 + (uVar10 / 0x42) * 2)) {
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    xpub.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&xpub.serialize_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&xpub,"whitelist length error.","");
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&xpub);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (1000000000 < bip32_counter) {
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    xpub.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&xpub.serialize_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&xpub,"bip32_counter over error.","");
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&xpub);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar3 = Pubkey::IsValid(online_pubkey);
  bVar4 = true;
  if ((bVar3) && (bVar3 = Privkey::IsValid(master_online_key), bVar3)) {
    Privkey::GeneratePubkey(&local_78,master_online_key,true);
    bVar4 = Pubkey::Equals(&local_78,online_pubkey);
    bVar4 = !bVar4;
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  if ((bVar3) &&
     (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_78.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (bVar4) {
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    xpub.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&xpub.serialize_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&xpub,"Illegal online key error.","");
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&xpub);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (0x4241 < uVar10) {
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    xpub.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&xpub.serialize_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&xpub,"Illegal whitelist maximum error.","");
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&xpub);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (0x41 < uVar10) {
    local_2c0._M_current =
         (uchar *)CONCAT44(whitelist_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           (int)whitelist_bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    local_110 = (ulong)(uVar10 / 0x42 + (uint)(uVar10 / 0x42 == 0));
    do {
      __last._M_current = local_2c0._M_current + 0x21;
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&child_xpub,local_2c0,__last
                 ,(allocator_type *)&tweak_sum);
      ByteData::ByteData(&local_48,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&child_xpub);
      Pubkey::Pubkey((Pubkey *)&xpub,&local_48);
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (child_xpub.serialize_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(child_xpub.serialize_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      Pubkey::GetData(&child_xpub.serialize_data_,(Pubkey *)&xpub);
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>(&offline_keys,&child_xpub.serialize_data_);
      if (child_xpub.serialize_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(child_xpub.serialize_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_2c0._M_current = local_2c0._M_current + 0x42;
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tweak_sum,__last,local_2c0,
                 (allocator_type *)&prefix);
      ByteData::ByteData(&local_60,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sum);
      Pubkey::Pubkey((Pubkey *)&child_xpub,&local_60);
      if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(tweak_sum.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      Pubkey::GetData((ByteData *)&tweak_sum,(Pubkey *)&child_xpub);
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>(&online_keys,(ByteData *)&tweak_sum);
      if (tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(tweak_sum.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (child_xpub.serialize_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(child_xpub.serialize_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (xpub.serialize_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(xpub.serialize_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_110 = local_110 - 1;
    } while (local_110 != 0);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&prefix,&pubkey_prefix->data_)
  ;
  if (net_type - kTestnet < 2) {
    ppuVar1 = &xpub.serialize_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    xpub.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&xpub,"043587cf","");
    ByteData::ByteData(&child_xpub.serialize_data_,(string *)&xpub);
    puVar6 = prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         child_xpub.serialize_data_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         child_xpub.serialize_data_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         child_xpub.serialize_data_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    child_xpub.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    child_xpub.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    child_xpub.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar6 != (pointer)0x0) {
      operator_delete(puVar6);
    }
    if (child_xpub.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(child_xpub.serialize_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer *)
        xpub.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start == ppuVar1) goto LAB_00386755;
  }
  else {
    if (net_type != kMainnet) {
      sVar5 = ByteData::GetDataSize(&prefix);
      if (sVar5 != 4) {
        pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
        xpub.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&xpub.serialize_data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&xpub,"Illegal prefix and nettype.","");
        CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&xpub);
        __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
      }
      goto LAB_00386755;
    }
    ppuVar1 = &xpub.serialize_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    xpub.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&xpub,"0488b21e","");
    ByteData::ByteData(&child_xpub.serialize_data_,(string *)&xpub);
    puVar6 = prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         child_xpub.serialize_data_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         child_xpub.serialize_data_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         child_xpub.serialize_data_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    child_xpub.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    child_xpub.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    child_xpub.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar6 != (pointer)0x0) {
      operator_delete(puVar6);
    }
    if (child_xpub.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(child_xpub.serialize_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer *)
        xpub.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start == ppuVar1) goto LAB_00386755;
  }
  operator_delete(xpub.serialize_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_00386755:
  ExtPubkey::ExtPubkey(&xpub);
  GenerateExtPubkeyFromDescriptor
            (&child_xpub,bitcoin_descriptor,bip32_counter,&prefix,net_type,elements_net_type,&xpub,
             descriptor_derive_address);
  Pubkey::GetData(&local_90,online_pubkey);
  bVar4 = online_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          online_keys.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
          _M_impl.super__Vector_impl_data._M_start;
  if (bVar4) {
    uVar9 = 0;
    do {
      bVar3 = ByteData::Equals(&local_90,
                               online_keys.
                               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar9);
      if (bVar3) goto LAB_00386819;
      uVar9 = (ulong)((int)uVar9 + 1);
      uVar8 = ((long)online_keys.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)online_keys.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      bVar3 = uVar8 - uVar9 != 0;
      bVar4 = uVar9 <= uVar8 && bVar3;
    } while (uVar9 <= uVar8 && bVar3);
  }
  uVar9 = 0;
LAB_00386819:
  if (!bVar4) {
    tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcore_elements_transaction.cpp";
    tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0xc8c;
    tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "GetPegoutPubkeyData";
    logger::log<>((CfdSourceLocation *)&tweak_sum,kCfdLogLevelWarning,"online_pubkey not exists.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tweak_sum,"online_pubkey not exists.","");
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&tweak_sum);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ExtPubkey::GetPubkey(&offline_pubkey,&xpub);
  Pubkey::GetData((ByteData *)&tweak_sum,&offline_pubkey);
  WallyUtil::NegatePubkey(&offline_pubkey_negate,(ByteData *)&tweak_sum);
  if (tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tweak_sum.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  bVar4 = ByteData::Equals(offline_keys.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar9,&offline_pubkey_negate)
  ;
  if (!bVar4) {
    tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcore_elements_transaction.cpp";
    tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0xc94;
    tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "GetPegoutPubkeyData";
    logger::log<>((CfdSourceLocation *)&tweak_sum,kCfdLogLevelWarning,"offline_pubkey not exists.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tweak_sum,"offline_pubkey not exists.","");
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&tweak_sum);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ExtPubkey::GetPubTweakSum(&tweak_sum,&child_xpub);
  Pubkey::GetData(&whitelist_proof,&offline_pubkey);
  WallyUtil::AddTweakPubkey(&btcpubkeybytes,&whitelist_proof,&tweak_sum,false);
  if (whitelist_proof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(whitelist_proof.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Privkey::GetData(&local_d8,master_online_key);
  ByteData::GetBytes(&local_c0,&local_d8);
  ByteData256::ByteData256((ByteData256 *)&local_2b8,&local_c0);
  WallyUtil::SignWhitelist
            (&whitelist_proof,&btcpubkeybytes,(ByteData256 *)&local_2b8,&tweak_sum,&online_keys,
             &offline_keys,(uint32_t)uVar9);
  if (local_2b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = (long)btcpubkeybytes.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)btcpubkeybytes.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar9 == 0) {
    puVar6 = (pointer)0x0;
  }
  else {
    if ((long)uVar9 < 0) {
      ::std::__throw_bad_alloc();
    }
    puVar6 = (pointer)operator_new(uVar9);
  }
  local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar6 + uVar9;
  __n = (long)btcpubkeybytes.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)btcpubkeybytes.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar6;
  if (__n != 0) {
    local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6;
    memmove(puVar6,btcpubkeybytes.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,__n);
  }
  local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar6 + __n;
  Pubkey::Pubkey(&local_2b8,&local_208);
  pvVar2 = (__return_storage_ptr__->btc_pubkey_bytes).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (__return_storage_ptr__->btc_pubkey_bytes).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_2b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->btc_pubkey_bytes).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_2b8.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->btc_pubkey_bytes).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_2b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2);
  }
  if (local_2b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &__return_storage_ptr__->whitelist_proof,&whitelist_proof.data_);
  if (whitelist_proof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(whitelist_proof.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (btcpubkeybytes.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(btcpubkeybytes.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tweak_sum.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (offline_pubkey_negate.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(offline_pubkey_negate.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (offline_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(offline_pubkey.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (child_xpub.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(child_xpub.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (child_xpub.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(child_xpub.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (child_xpub.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(child_xpub.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (child_xpub.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(child_xpub.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (xpub.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(xpub.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (xpub.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(xpub.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (xpub.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(xpub.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (xpub.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(xpub.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(whitelist_bytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       (int)whitelist_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(whitelist_bytes.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)whitelist_bytes.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
  }
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&online_keys);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&offline_keys);
  return __return_storage_ptr__;
}

Assistant:

PegoutKeyData ConfidentialTransaction::GetPegoutPubkeyData(
    const Pubkey &online_pubkey, const Privkey &master_online_key,
    const std::string &bitcoin_descriptor, uint32_t bip32_counter,
    const ByteData &whitelist, NetType net_type, const ByteData &pubkey_prefix,
    NetType elements_net_type, Address *descriptor_derive_address) {
  static constexpr uint32_t kPegoutBip32CountMaximum = 1000000000;
  static constexpr uint32_t kWhitelistCountMaximum = 256;
  static constexpr uint32_t kPubkeySize = Pubkey::kCompressedPubkeySize;
  static constexpr uint32_t kWhitelistSingleSize = kPubkeySize * 2;
  PegoutKeyData result;
  std::vector<ByteData> offline_keys;
  std::vector<ByteData> online_keys;
  std::vector<uint8_t> whitelist_bytes = whitelist.GetBytes();
  uint32_t whitelist_size = static_cast<uint32_t>(whitelist_bytes.size());

  if ((whitelist_size == 0) ||
      ((whitelist_size % kWhitelistSingleSize) != 0)) {
    throw CfdException(kCfdIllegalArgumentError, "whitelist length error.");
  }
  // parameter check
  if (bip32_counter > kPegoutBip32CountMaximum) {
    throw CfdException(kCfdIllegalArgumentError, "bip32_counter over error.");
  }
  if ((!online_pubkey.IsValid()) || (!master_online_key.IsValid()) ||
      (!master_online_key.GeneratePubkey().Equals(online_pubkey))) {
    throw CfdException(kCfdIllegalArgumentError, "Illegal online key error.");
  }

  // CreatePAKListFromExtensionSpace
  decltype(whitelist_bytes)::const_iterator ite = whitelist_bytes.begin();
  uint32_t whitelist_count = whitelist_size / kWhitelistSingleSize;
  if (whitelist_count > kWhitelistCountMaximum) {
    throw CfdException(
        kCfdIllegalArgumentError, "Illegal whitelist maximum error.");
  }

  try {
    for (uint32_t index = 0; index < whitelist_count; ++index) {
      uint32_t offline_key_start = index * kWhitelistSingleSize;
      uint32_t offline_key_end = offline_key_start + kPubkeySize;
      uint32_t online_key_start = offline_key_start + kPubkeySize;
      uint32_t online_key_end = (index + 1) * kWhitelistSingleSize;
      Pubkey offline_key(std::vector<uint8_t>(
          ite + offline_key_start, ite + offline_key_end));
      offline_keys.push_back(offline_key.GetData());
      Pubkey online_key(
          std::vector<uint8_t>(ite + online_key_start, ite + online_key_end));
      online_keys.push_back(online_key.GetData());
    }
  } catch (const CfdException &except) {
    throw CfdException(
        kCfdIllegalArgumentError,
        "Illegal whitelist key. (" + std::string(except.what()) + ")");
  }

  ByteData prefix = pubkey_prefix;
  if ((net_type == NetType::kTestnet) || ((net_type == NetType::kRegtest))) {
    prefix = ByteData("043587cf");
  } else if (net_type == NetType::kMainnet) {
    prefix = ByteData("0488b21e");
  } else if (prefix.GetDataSize() != 4) {
    throw CfdException(
        kCfdIllegalArgumentError, "Illegal prefix and nettype.");
  }

  // check descriptor
  ExtPubkey xpub;
  ExtPubkey child_xpub = GenerateExtPubkeyFromDescriptor(
      bitcoin_descriptor, bip32_counter, prefix, net_type, elements_net_type,
      &xpub, descriptor_derive_address);
  // FlatSigningProvider provider;
  // const auto descriptor = Parse(desc_str, provider);
  // if (!descriptor) desc_str = "pkh(" + xpub.GetBase58String() + "/0/*)";

  // check whitelist
  uint32_t whitelist_index = 0;
  bool is_find = false;
  const ByteData &online_pubkey_bytes = online_pubkey.GetData();
  for (uint32_t index = 0; index < online_keys.size(); ++index) {
    if (online_pubkey_bytes.Equals(online_keys[index])) {
      whitelist_index = index;
      is_find = true;
      break;
    }
  }
  if (!is_find) {
    warn(CFD_LOG_SOURCE, "online_pubkey not exists.");
    throw CfdException(kCfdIllegalArgumentError, "online_pubkey not exists.");
  }

  Pubkey offline_pubkey = xpub.GetPubkey();
  ByteData offline_pubkey_negate =
      WallyUtil::NegatePubkey(offline_pubkey.GetData());
  if (!offline_keys[whitelist_index].Equals(offline_pubkey_negate)) {
    warn(CFD_LOG_SOURCE, "offline_pubkey not exists.");
    throw CfdException(kCfdIllegalArgumentError, "offline_pubkey not exists.");
  }

  // calc tweak
  ByteData256 tweak_sum = child_xpub.GetPubTweakSum();
  ByteData btcpubkeybytes =
      WallyUtil::AddTweakPubkey(offline_pubkey.GetData(), tweak_sum);

  ByteData whitelist_proof = WallyUtil::SignWhitelist(
      btcpubkeybytes, ByteData256(master_online_key.GetData().GetBytes()),
      tweak_sum, online_keys, offline_keys, whitelist_index);

  result.btc_pubkey_bytes = Pubkey(btcpubkeybytes);
  result.whitelist_proof = whitelist_proof;
  return result;
}